

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void handle_cgi(mg_connection *nc,char *prog,http_message *hm,mg_serve_http_opts *opts)

{
  pid_t pVar1;
  ulong uVar2;
  mg_connection *pmVar3;
  size_t n;
  sock_t fds [2];
  char *p;
  char dir [500];
  cgi_env_block blk;
  proto_data_http *dp;
  mg_serve_http_opts *opts_local;
  http_message *hm_local;
  char *prog_local;
  mg_connection *nc_local;
  
  prepare_cgi_environment(nc,prog,hm,opts,(cgi_env_block *)(dir + 0x1f0));
  fds = (sock_t  [2])strrchr(prog,0x2f);
  if (fds == (sock_t  [2])0x0) {
    snprintf((char *)&p,500,"%s",".");
    hm_local = (http_message *)prog;
  }
  else {
    snprintf((char *)&p,500,"%.*s",(ulong)(uint)(fds[0] - (int)prog),prog);
    hm_local = (http_message *)((long)fds + 1);
  }
  do {
    mg_socketpair((sock_t *)&n,1);
  } while ((int)n == -1);
  free_http_proto_data(nc);
  blk._8712_8_ = calloc(1,0x30);
  if ((void *)blk._8712_8_ == (void *)0x0) {
    send_http_error(nc,500,"OOM");
  }
  else {
    pVar1 = start_process(opts->cgi_interpreter,(char *)hm_local,(char *)&blk,
                          (char **)(blk.buf + 0x1ff8),(char *)&p,n._4_4_);
    if (pVar1 == 0) {
      close((int)n);
      send_http_error(nc,500,"CGI failure");
    }
    else {
      uVar2 = (nc->recv_mbuf).len - ((hm->message).len - (hm->body).len);
      *(undefined4 *)(blk._8712_8_ + 0x28) = 3;
      pmVar3 = mg_add_sock(nc->mgr,(int)n,cgi_ev_handler);
      *(mg_connection **)(blk._8712_8_ + 0x20) = pmVar3;
      *(mg_connection **)(*(long *)(blk._8712_8_ + 0x20) + 0xa8) = nc;
      *(undefined8 *)(*(long *)(blk._8712_8_ + 0x20) + 0x98) = blk._8712_8_;
      nc->flags = nc->flags | 0x100000;
      if ((uVar2 != 0) && (uVar2 < (nc->recv_mbuf).len)) {
        mg_send(*(mg_connection **)(blk._8712_8_ + 0x20),(hm->body).p,(int)uVar2);
      }
      mbuf_remove(&nc->recv_mbuf,(nc->recv_mbuf).len);
    }
  }
  close(n._4_4_);
  return;
}

Assistant:

static void handle_cgi(struct mg_connection *nc, const char *prog,
                       const struct http_message *hm,
                       const struct mg_serve_http_opts *opts) {
    struct proto_data_http *dp;
    struct cgi_env_block blk;
    char dir[MAX_PATH_SIZE];
    const char *p;
    sock_t fds[2];

    prepare_cgi_environment(nc, prog, hm, opts, &blk);
    /*
   * CGI must be executed in its own directory. 'dir' must point to the
   * directory containing executable program, 'p' must point to the
   * executable program name relative to 'dir'.
   */
    if ((p = strrchr(prog, '/')) == NULL) {
        snprintf(dir, sizeof(dir), "%s", ".");
    } else {
        snprintf(dir, sizeof(dir), "%.*s", (int) (p - prog), prog);
        prog = p + 1;
    }

    /*
   * Try to create socketpair in a loop until success. mg_socketpair()
   * can be interrupted by a signal and fail.
   * TODO(lsm): use sigaction to restart interrupted syscall
   */
    do {
        mg_socketpair(fds, SOCK_STREAM);
    } while (fds[0] == INVALID_SOCKET);

    free_http_proto_data(nc);
    if ((dp = (struct proto_data_http *) MG_CALLOC(1, sizeof(*dp))) == NULL) {
        send_http_error(nc, 500, "OOM"); /* LCOV_EXCL_LINE */
    } else if (start_process(opts->cgi_interpreter, prog, blk.buf, blk.vars, dir,
                             fds[1]) != 0) {
        size_t n = nc->recv_mbuf.len - (hm->message.len - hm->body.len);
        dp->type = DATA_CGI;
        dp->cgi_nc = mg_add_sock(nc->mgr, fds[0], cgi_ev_handler);
        dp->cgi_nc->user_data = nc;
        dp->cgi_nc->proto_data = dp;
        nc->flags |= MG_F_USER_1;
        /* Push POST data to the CGI */
        if (n > 0 && n < nc->recv_mbuf.len) {
            mg_send(dp->cgi_nc, hm->body.p, n);
        }
        mbuf_remove(&nc->recv_mbuf, nc->recv_mbuf.len);
    } else {
        closesocket(fds[0]);
        send_http_error(nc, 500, "CGI failure");
    }

#ifndef _WIN32
    closesocket(fds[1]); /* On Windows, CGI stdio thread closes that socket */
#endif
}